

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRVersion.cpp
# Opt level: O3

Version * ZXing::QRCode::Version::Model2(int number)

{
  int iVar1;
  Version *pVVar2;
  long lVar3;
  int *piVar4;
  array<ZXing::QRCode::ECBlocks,_4UL> *paVar5;
  byte bVar6;
  initializer_list<int> alignmentPatternCenters;
  initializer_list<int> alignmentPatternCenters_00;
  initializer_list<int> alignmentPatternCenters_01;
  initializer_list<int> alignmentPatternCenters_02;
  initializer_list<int> alignmentPatternCenters_03;
  initializer_list<int> alignmentPatternCenters_04;
  initializer_list<int> alignmentPatternCenters_05;
  initializer_list<int> alignmentPatternCenters_06;
  initializer_list<int> alignmentPatternCenters_07;
  initializer_list<int> alignmentPatternCenters_08;
  initializer_list<int> alignmentPatternCenters_09;
  initializer_list<int> alignmentPatternCenters_10;
  initializer_list<int> alignmentPatternCenters_11;
  initializer_list<int> alignmentPatternCenters_12;
  initializer_list<int> alignmentPatternCenters_13;
  initializer_list<int> alignmentPatternCenters_14;
  initializer_list<int> alignmentPatternCenters_15;
  initializer_list<int> alignmentPatternCenters_16;
  initializer_list<int> alignmentPatternCenters_17;
  initializer_list<int> alignmentPatternCenters_18;
  initializer_list<int> alignmentPatternCenters_19;
  initializer_list<int> alignmentPatternCenters_20;
  initializer_list<int> alignmentPatternCenters_21;
  initializer_list<int> alignmentPatternCenters_22;
  initializer_list<int> alignmentPatternCenters_23;
  initializer_list<int> alignmentPatternCenters_24;
  initializer_list<int> alignmentPatternCenters_25;
  initializer_list<int> alignmentPatternCenters_26;
  initializer_list<int> alignmentPatternCenters_27;
  initializer_list<int> alignmentPatternCenters_28;
  initializer_list<int> alignmentPatternCenters_29;
  initializer_list<int> alignmentPatternCenters_30;
  initializer_list<int> alignmentPatternCenters_31;
  initializer_list<int> alignmentPatternCenters_32;
  initializer_list<int> alignmentPatternCenters_33;
  initializer_list<int> alignmentPatternCenters_34;
  initializer_list<int> alignmentPatternCenters_35;
  initializer_list<int> alignmentPatternCenters_36;
  initializer_list<int> alignmentPatternCenters_37;
  int local_1024 [67];
  int local_f18 [8];
  int local_ef8 [8];
  int local_ed8 [8];
  int local_eb8 [8];
  int local_e98 [8];
  int local_e78 [8];
  int local_e58 [8];
  int local_e38 [8];
  int local_e18 [8];
  int local_df8 [8];
  int local_dd8 [8];
  int local_db8 [8];
  int local_d98 [8];
  int local_d78 [8];
  int local_d58 [8];
  int local_d38 [8];
  int local_d18 [8];
  int local_cf8 [8];
  int local_cd8 [10];
  array<ZXing::QRCode::ECBlocks,_4UL> local_cb0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_c60;
  array<ZXing::QRCode::ECBlocks,_4UL> local_c10;
  array<ZXing::QRCode::ECBlocks,_4UL> local_bc0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_b70;
  array<ZXing::QRCode::ECBlocks,_4UL> local_b20;
  array<ZXing::QRCode::ECBlocks,_4UL> local_ad0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_a80;
  array<ZXing::QRCode::ECBlocks,_4UL> local_a30;
  array<ZXing::QRCode::ECBlocks,_4UL> local_9e0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_990;
  array<ZXing::QRCode::ECBlocks,_4UL> local_940;
  array<ZXing::QRCode::ECBlocks,_4UL> local_8f0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_8a0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_850;
  array<ZXing::QRCode::ECBlocks,_4UL> local_800;
  array<ZXing::QRCode::ECBlocks,_4UL> local_7b0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_760;
  array<ZXing::QRCode::ECBlocks,_4UL> local_710;
  array<ZXing::QRCode::ECBlocks,_4UL> local_6c0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_670;
  array<ZXing::QRCode::ECBlocks,_4UL> local_620;
  array<ZXing::QRCode::ECBlocks,_4UL> local_5d0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_580;
  array<ZXing::QRCode::ECBlocks,_4UL> local_530;
  array<ZXing::QRCode::ECBlocks,_4UL> local_4e0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_490;
  array<ZXing::QRCode::ECBlocks,_4UL> local_440;
  array<ZXing::QRCode::ECBlocks,_4UL> local_3f0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_3a0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_350;
  array<ZXing::QRCode::ECBlocks,_4UL> local_300;
  array<ZXing::QRCode::ECBlocks,_4UL> local_2b0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_260;
  array<ZXing::QRCode::ECBlocks,_4UL> local_210;
  array<ZXing::QRCode::ECBlocks,_4UL> local_1c0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_170;
  array<ZXing::QRCode::ECBlocks,_4UL> local_120;
  array<ZXing::QRCode::ECBlocks,_4UL> local_d0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_80;
  
  bVar6 = 0;
  if (Model2(int)::allVersions == '\0') {
    iVar1 = __cxa_guard_acquire(&Model2(int)::allVersions);
    if (iVar1 != 0) {
      piVar4 = &DAT_0019fbbc;
      paVar5 = &local_80;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model2::allVersions,1,(initializer_list<int>)ZEXT816(0),&local_80);
      local_1024[8] = 6;
      local_1024[9] = 0x12;
      piVar4 = &DAT_0019e310;
      paVar5 = &local_d0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters._M_len = 2;
      alignmentPatternCenters._M_array = local_1024 + 8;
      Version(Model2::allVersions + 1,2,alignmentPatternCenters,&local_d0);
      local_1024[6] = 6;
      local_1024[7] = 0x16;
      piVar4 = &DAT_0019e360;
      paVar5 = &local_120;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_00._M_len = 2;
      alignmentPatternCenters_00._M_array = local_1024 + 6;
      Version(Model2::allVersions + 2,3,alignmentPatternCenters_00,&local_120);
      local_1024[4] = 6;
      local_1024[5] = 0x1a;
      piVar4 = &DAT_0019e3b0;
      paVar5 = &local_170;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_01._M_len = 2;
      alignmentPatternCenters_01._M_array = local_1024 + 4;
      Version(Model2::allVersions + 3,4,alignmentPatternCenters_01,&local_170);
      local_1024[2] = 6;
      local_1024[3] = 0x1e;
      piVar4 = &DAT_0019e400;
      paVar5 = &local_1c0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_02._M_len = 2;
      alignmentPatternCenters_02._M_array = local_1024 + 2;
      Version(Model2::allVersions + 4,5,alignmentPatternCenters_02,&local_1c0);
      local_1024[0] = 6;
      local_1024[1] = 0x22;
      piVar4 = &DAT_0019e450;
      paVar5 = &local_210;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_03._M_len = 2;
      alignmentPatternCenters_03._M_array = local_1024;
      Version(Model2::allVersions + 5,6,alignmentPatternCenters_03,&local_210);
      local_1024[0x1c] = 6;
      local_1024[0x1d] = 0x16;
      local_1024[0x1e] = 0x26;
      piVar4 = &DAT_0019e4a0;
      paVar5 = &local_260;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_04._M_len = 3;
      alignmentPatternCenters_04._M_array = local_1024 + 0x1c;
      Version(Model2::allVersions + 6,7,alignmentPatternCenters_04,&local_260);
      local_1024[0x19] = 6;
      local_1024[0x1a] = 0x18;
      local_1024[0x1b] = 0x2a;
      piVar4 = &DAT_0019e4f0;
      paVar5 = &local_2b0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_05._M_len = 3;
      alignmentPatternCenters_05._M_array = local_1024 + 0x19;
      Version(Model2::allVersions + 7,8,alignmentPatternCenters_05,&local_2b0);
      local_1024[0x16] = 6;
      local_1024[0x17] = 0x1a;
      local_1024[0x18] = 0x2e;
      piVar4 = &DAT_0019e540;
      paVar5 = &local_300;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_06._M_len = 3;
      alignmentPatternCenters_06._M_array = local_1024 + 0x16;
      Version(Model2::allVersions + 8,9,alignmentPatternCenters_06,&local_300);
      local_1024[0x13] = 6;
      local_1024[0x14] = 0x1c;
      local_1024[0x15] = 0x32;
      piVar4 = &DAT_0019e590;
      paVar5 = &local_350;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_07._M_len = 3;
      alignmentPatternCenters_07._M_array = local_1024 + 0x13;
      Version(Model2::allVersions + 9,10,alignmentPatternCenters_07,&local_350);
      local_1024[0x10] = 6;
      local_1024[0x11] = 0x1e;
      local_1024[0x12] = 0x36;
      piVar4 = &DAT_0019e5e0;
      paVar5 = &local_3a0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_08._M_len = 3;
      alignmentPatternCenters_08._M_array = local_1024 + 0x10;
      Version(Model2::allVersions + 10,0xb,alignmentPatternCenters_08,&local_3a0);
      local_1024[0xd] = 6;
      local_1024[0xe] = 0x20;
      local_1024[0xf] = 0x3a;
      piVar4 = &DAT_0019e630;
      paVar5 = &local_3f0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_09._M_len = 3;
      alignmentPatternCenters_09._M_array = local_1024 + 0xd;
      Version(Model2::allVersions + 0xb,0xc,alignmentPatternCenters_09,&local_3f0);
      local_1024[10] = 6;
      local_1024[0xb] = 0x22;
      local_1024[0xc] = 0x3e;
      piVar4 = &DAT_0019e680;
      paVar5 = &local_440;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_10._M_len = 3;
      alignmentPatternCenters_10._M_array = local_1024 + 10;
      Version(Model2::allVersions + 0xc,0xd,alignmentPatternCenters_10,&local_440);
      local_1024[0x37] = 6;
      local_1024[0x38] = 0x1a;
      local_1024[0x39] = 0x2e;
      local_1024[0x3a] = 0x42;
      piVar4 = &DAT_0019e6d0;
      paVar5 = &local_490;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_11._M_len = 4;
      alignmentPatternCenters_11._M_array = local_1024 + 0x37;
      Version(Model2::allVersions + 0xd,0xe,alignmentPatternCenters_11,&local_490);
      local_1024[0x33] = 6;
      local_1024[0x34] = 0x1a;
      local_1024[0x35] = 0x30;
      local_1024[0x36] = 0x46;
      piVar4 = &DAT_0019e720;
      paVar5 = &local_4e0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_12._M_len = 4;
      alignmentPatternCenters_12._M_array = local_1024 + 0x33;
      Version(Model2::allVersions + 0xe,0xf,alignmentPatternCenters_12,&local_4e0);
      local_1024[0x2f] = 6;
      local_1024[0x30] = 0x1a;
      local_1024[0x31] = 0x32;
      local_1024[0x32] = 0x4a;
      piVar4 = &DAT_0019e770;
      paVar5 = &local_530;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_13._M_len = 4;
      alignmentPatternCenters_13._M_array = local_1024 + 0x2f;
      Version(Model2::allVersions + 0xf,0x10,alignmentPatternCenters_13,&local_530);
      local_1024[0x2b] = 6;
      local_1024[0x2c] = 0x1e;
      local_1024[0x2d] = 0x36;
      local_1024[0x2e] = 0x4e;
      piVar4 = &DAT_0019e7c0;
      paVar5 = &local_580;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_14._M_len = 4;
      alignmentPatternCenters_14._M_array = local_1024 + 0x2b;
      Version(Model2::allVersions + 0x10,0x11,alignmentPatternCenters_14,&local_580);
      local_1024[0x27] = 6;
      local_1024[0x28] = 0x1e;
      local_1024[0x29] = 0x38;
      local_1024[0x2a] = 0x52;
      piVar4 = &DAT_0019e810;
      paVar5 = &local_5d0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_15._M_len = 4;
      alignmentPatternCenters_15._M_array = local_1024 + 0x27;
      Version(Model2::allVersions + 0x11,0x12,alignmentPatternCenters_15,&local_5d0);
      local_1024[0x23] = 6;
      local_1024[0x24] = 0x1e;
      local_1024[0x25] = 0x3a;
      local_1024[0x26] = 0x56;
      piVar4 = &DAT_0019e860;
      paVar5 = &local_620;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_16._M_len = 4;
      alignmentPatternCenters_16._M_array = local_1024 + 0x23;
      Version(Model2::allVersions + 0x12,0x13,alignmentPatternCenters_16,&local_620);
      local_1024[0x1f] = 6;
      local_1024[0x20] = 0x22;
      local_1024[0x21] = 0x3e;
      local_1024[0x22] = 0x5a;
      piVar4 = &DAT_0019e8b0;
      paVar5 = &local_670;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_17._M_len = 4;
      alignmentPatternCenters_17._M_array = local_1024 + 0x1f;
      Version(Model2::allVersions + 0x13,0x14,alignmentPatternCenters_17,&local_670);
      local_e78[0] = 6;
      local_e78[1] = 0x1c;
      local_e78[2] = 0x32;
      local_e78[3] = 0x48;
      local_e78[4] = 0x5e;
      piVar4 = &DAT_0019e914;
      paVar5 = &local_6c0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_18._M_len = 5;
      alignmentPatternCenters_18._M_array = local_e78;
      Version(Model2::allVersions + 0x14,0x15,alignmentPatternCenters_18,&local_6c0);
      local_e98[0] = 6;
      local_e98[1] = 0x1a;
      local_e98[2] = 0x32;
      local_e98[3] = 0x4a;
      local_e98[4] = 0x62;
      piVar4 = &DAT_0019e978;
      paVar5 = &local_710;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_19._M_len = 5;
      alignmentPatternCenters_19._M_array = local_e98;
      Version(Model2::allVersions + 0x15,0x16,alignmentPatternCenters_19,&local_710);
      local_eb8[0] = 6;
      local_eb8[1] = 0x1e;
      local_eb8[2] = 0x36;
      local_eb8[3] = 0x4e;
      local_eb8[4] = 0x66;
      piVar4 = &DAT_0019e9dc;
      paVar5 = &local_760;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_20._M_len = 5;
      alignmentPatternCenters_20._M_array = local_eb8;
      Version(Model2::allVersions + 0x16,0x17,alignmentPatternCenters_20,&local_760);
      local_ed8[0] = 6;
      local_ed8[1] = 0x1c;
      local_ed8[2] = 0x36;
      local_ed8[3] = 0x50;
      local_ed8[4] = 0x6a;
      piVar4 = &DAT_0019ea40;
      paVar5 = &local_7b0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_21._M_len = 5;
      alignmentPatternCenters_21._M_array = local_ed8;
      Version(Model2::allVersions + 0x17,0x18,alignmentPatternCenters_21,&local_7b0);
      local_ef8[0] = 6;
      local_ef8[1] = 0x20;
      local_ef8[2] = 0x3a;
      local_ef8[3] = 0x54;
      local_ef8[4] = 0x6e;
      piVar4 = &DAT_0019eaa4;
      paVar5 = &local_800;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_22._M_len = 5;
      alignmentPatternCenters_22._M_array = local_ef8;
      Version(Model2::allVersions + 0x18,0x19,alignmentPatternCenters_22,&local_800);
      local_f18[0] = 6;
      local_f18[1] = 0x1e;
      local_f18[2] = 0x3a;
      local_f18[3] = 0x56;
      local_f18[4] = 0x72;
      piVar4 = &DAT_0019eb08;
      paVar5 = &local_850;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_23._M_len = 5;
      alignmentPatternCenters_23._M_array = local_f18;
      Version(Model2::allVersions + 0x19,0x1a,alignmentPatternCenters_23,&local_850);
      local_1024[0x3b] = 6;
      local_1024[0x3c] = 0x22;
      local_1024[0x3d] = 0x3e;
      local_1024[0x3e] = 0x5a;
      local_1024[0x3f] = 0x76;
      piVar4 = &DAT_0019eb6c;
      paVar5 = &local_8a0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_24._M_len = 5;
      alignmentPatternCenters_24._M_array = local_1024 + 0x3b;
      Version(Model2::allVersions + 0x1a,0x1b,alignmentPatternCenters_24,&local_8a0);
      local_d98[0] = 6;
      local_d98[1] = 0x1a;
      local_d98[2] = 0x32;
      local_d98[3] = 0x4a;
      local_d98[4] = 0x62;
      local_d98[5] = 0x7a;
      piVar4 = &DAT_0019ebd4;
      paVar5 = &local_8f0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_25._M_len = 6;
      alignmentPatternCenters_25._M_array = local_d98;
      Version(Model2::allVersions + 0x1b,0x1c,alignmentPatternCenters_25,&local_8f0);
      local_db8[0] = 6;
      local_db8[1] = 0x1e;
      local_db8[2] = 0x36;
      local_db8[3] = 0x4e;
      local_db8[4] = 0x66;
      local_db8[5] = 0x7e;
      piVar4 = &DAT_0019ec3c;
      paVar5 = &local_940;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_26._M_len = 6;
      alignmentPatternCenters_26._M_array = local_db8;
      Version(Model2::allVersions + 0x1c,0x1d,alignmentPatternCenters_26,&local_940);
      local_dd8[0] = 6;
      local_dd8[1] = 0x1a;
      local_dd8[2] = 0x34;
      local_dd8[3] = 0x4e;
      local_dd8[4] = 0x68;
      local_dd8[5] = 0x82;
      piVar4 = &DAT_0019eca4;
      paVar5 = &local_990;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_27._M_len = 6;
      alignmentPatternCenters_27._M_array = local_dd8;
      Version(Model2::allVersions + 0x1d,0x1e,alignmentPatternCenters_27,&local_990);
      local_df8[0] = 6;
      local_df8[1] = 0x1e;
      local_df8[2] = 0x38;
      local_df8[3] = 0x52;
      local_df8[4] = 0x6c;
      local_df8[5] = 0x86;
      piVar4 = &DAT_0019ed0c;
      paVar5 = &local_9e0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_28._M_len = 6;
      alignmentPatternCenters_28._M_array = local_df8;
      Version(Model2::allVersions + 0x1e,0x1f,alignmentPatternCenters_28,&local_9e0);
      local_e18[0] = 6;
      local_e18[1] = 0x22;
      local_e18[2] = 0x3c;
      local_e18[3] = 0x56;
      local_e18[4] = 0x70;
      local_e18[5] = 0x8a;
      piVar4 = &DAT_0019ed74;
      paVar5 = &local_a30;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_29._M_len = 6;
      alignmentPatternCenters_29._M_array = local_e18;
      Version(Model2::allVersions + 0x1f,0x20,alignmentPatternCenters_29,&local_a30);
      local_e38[0] = 6;
      local_e38[1] = 0x1e;
      local_e38[2] = 0x3a;
      local_e38[3] = 0x56;
      local_e38[4] = 0x72;
      local_e38[5] = 0x8e;
      piVar4 = &DAT_0019eddc;
      paVar5 = &local_a80;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_30._M_len = 6;
      alignmentPatternCenters_30._M_array = local_e38;
      Version(Model2::allVersions + 0x20,0x21,alignmentPatternCenters_30,&local_a80);
      local_e58[0] = 6;
      local_e58[1] = 0x22;
      local_e58[2] = 0x3e;
      local_e58[3] = 0x5a;
      local_e58[4] = 0x76;
      local_e58[5] = 0x92;
      piVar4 = &DAT_0019ee44;
      paVar5 = &local_ad0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_31._M_len = 6;
      alignmentPatternCenters_31._M_array = local_e58;
      Version(Model2::allVersions + 0x21,0x22,alignmentPatternCenters_31,&local_ad0);
      local_cd8[4] = 0x66;
      local_cd8[5] = 0x7e;
      local_cd8[6] = 0x96;
      local_cd8[0] = 6;
      local_cd8[1] = 0x1e;
      local_cd8[2] = 0x36;
      local_cd8[3] = 0x4e;
      piVar4 = &DAT_0019eeb0;
      paVar5 = &local_b20;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_32._M_len = 7;
      alignmentPatternCenters_32._M_array = local_cd8;
      Version(Model2::allVersions + 0x22,0x23,alignmentPatternCenters_32,&local_b20);
      local_cf8[4] = 0x66;
      local_cf8[5] = 0x80;
      local_cf8[6] = 0x9a;
      local_cf8[0] = 6;
      local_cf8[1] = 0x18;
      local_cf8[2] = 0x32;
      local_cf8[3] = 0x4c;
      piVar4 = &DAT_0019ef1c;
      paVar5 = &local_b70;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_33._M_len = 7;
      alignmentPatternCenters_33._M_array = local_cf8;
      Version(Model2::allVersions + 0x23,0x24,alignmentPatternCenters_33,&local_b70);
      local_d18[4] = 0x6a;
      local_d18[5] = 0x84;
      local_d18[6] = 0x9e;
      local_d18[0] = 6;
      local_d18[1] = 0x1c;
      local_d18[2] = 0x36;
      local_d18[3] = 0x50;
      piVar4 = &DAT_0019ef88;
      paVar5 = &local_bc0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_34._M_len = 7;
      alignmentPatternCenters_34._M_array = local_d18;
      Version(Model2::allVersions + 0x24,0x25,alignmentPatternCenters_34,&local_bc0);
      local_d38[4] = 0x6e;
      local_d38[5] = 0x88;
      local_d38[6] = 0xa2;
      local_d38[0] = 6;
      local_d38[1] = 0x20;
      local_d38[2] = 0x3a;
      local_d38[3] = 0x54;
      piVar4 = &DAT_0019eff4;
      paVar5 = &local_c10;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_35._M_len = 7;
      alignmentPatternCenters_35._M_array = local_d38;
      Version(Model2::allVersions + 0x25,0x26,alignmentPatternCenters_35,&local_c10);
      local_d58[4] = 0x6e;
      local_d58[5] = 0x8a;
      local_d58[6] = 0xa6;
      local_d58[0] = 6;
      local_d58[1] = 0x1a;
      local_d58[2] = 0x36;
      local_d58[3] = 0x52;
      piVar4 = &DAT_0019f060;
      paVar5 = &local_c60;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_36._M_len = 7;
      alignmentPatternCenters_36._M_array = local_d58;
      Version(Model2::allVersions + 0x26,0x27,alignmentPatternCenters_36,&local_c60);
      local_d78[4] = 0x72;
      local_d78[5] = 0x8e;
      local_d78[6] = 0xaa;
      local_d78[0] = 6;
      local_d78[1] = 0x1e;
      local_d78[2] = 0x3a;
      local_d78[3] = 0x56;
      piVar4 = &DAT_0019f0cc;
      paVar5 = &local_cb0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      alignmentPatternCenters_37._M_len = 7;
      alignmentPatternCenters_37._M_array = local_d78;
      Version(Model2::allVersions + 0x27,0x28,alignmentPatternCenters_37,&local_cb0);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&Model2(int)::allVersions);
    }
  }
  pVVar2 = (Version *)0x0;
  if (0xffffffd7 < number - 0x29U) {
    pVVar2 = (Version *)
             &(&Pdf417::GetModulusGF::field)[(uint)number]._expTable.
              super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  }
  return pVVar2;
}

Assistant:

const Version* Version::Model2(int number)
{
	/**
	* See ISO 18004:2006 6.5.1 Table 9
	*/
	static const Version allVersions[] = {
		{1, {}, {
			7,  1, 19, 0, 0,
			10, 1, 16, 0, 0,
			13, 1, 13, 0, 0,
			17, 1, 9 , 0, 0
			}},
		{2, {6, 18}, {
			10, 1, 34, 0, 0,
			16, 1, 28, 0, 0,
			22, 1, 22, 0, 0,
			28, 1, 16, 0, 0,
			}},
		{3, {6, 22}, {
			15, 1, 55, 0, 0,
			26, 1, 44, 0, 0,
			18, 2, 17, 0, 0,
			22, 2, 13, 0, 0,
			}},
		{4, {6, 26}, {
			20, 1, 80, 0, 0,
			18, 2, 32, 0, 0,
			26, 2, 24, 0, 0,
			16, 4, 9 , 0, 0,
			}},
		{5, {6, 30}, {
			26, 1, 108, 0, 0,
			24, 2, 43 , 0, 0,
			18, 2, 15 , 2, 16,
			22, 2, 11 , 2, 12,
			}},
		{6, {6, 34}, {
			18, 2, 68, 0, 0,
			16, 4, 27, 0, 0,
			24, 4, 19, 0, 0,
			28, 4, 15, 0, 0,
			}},
		{7, {6, 22, 38}, {
			20, 2, 78, 0, 0,
			18, 4, 31, 0, 0,
			18, 2, 14, 4, 15,
			26, 4, 13, 1, 14,
			}},
		{8, {6, 24, 42}, {
			24, 2, 97, 0, 0,
			22, 2, 38, 2, 39,
			22, 4, 18, 2, 19,
			26, 4, 14, 2, 15,
			}},
		{9, {6, 26, 46}, {
			30, 2, 116, 0, 0,
			22, 3, 36, 2, 37,
			20, 4, 16, 4, 17,
			24, 4, 12, 4, 13,
			}},
		{10, {6, 28, 50}, {
			18, 2, 68, 2, 69,
			26, 4, 43, 1, 44,
			24, 6, 19, 2, 20,
			28, 6, 15, 2, 16,
			}},
		{11, {6, 30, 54}, {
			20, 4, 81, 0, 0,
			30, 1, 50, 4, 51,
			28, 4, 22, 4, 23,
			24, 3, 12, 8, 13,
			}},
		{12, {6, 32, 58}, {
			24, 2, 92, 2, 93,
			22, 6, 36, 2, 37,
			26, 4, 20, 6, 21,
			28, 7, 14, 4, 15,
			}},
		{13, {6, 34, 62}, {
			26, 4, 107, 0, 0,
			22, 8, 37, 1, 38,
			24, 8, 20, 4, 21,
			22, 12, 11, 4, 12,
			}},
		{14, {6, 26, 46, 66}, {
			30, 3, 115, 1, 116,
			24, 4, 40, 5, 41,
			20, 11, 16, 5, 17,
			24, 11, 12, 5, 13,
			}},
		{15, {6, 26, 48, 70}, {
			22, 5, 87, 1, 88,
			24, 5, 41, 5, 42,
			30, 5, 24, 7, 25,
			24, 11, 12, 7, 13,
			}},
		{16, {6, 26, 50, 74}, {
			24, 5, 98, 1, 99,
			28, 7, 45, 3, 46,
			24, 15, 19, 2, 20,
			30, 3, 15, 13, 16,
			}},
		{17, {6, 30, 54, 78}, {
			28, 1, 107, 5, 108,
			28, 10, 46, 1, 47,
			28, 1, 22, 15, 23,
			28, 2, 14, 17, 15,
			}},
		{18, {6, 30, 56, 82}, {
			30, 5, 120, 1, 121,
			26, 9, 43, 4, 44,
			28, 17, 22, 1, 23,
			28, 2, 14, 19, 15,
			}},
		{19, {6, 30, 58, 86}, {
			28, 3, 113, 4, 114,
			26, 3, 44, 11, 45,
			26, 17, 21, 4, 22,
			26, 9, 13, 16, 14,
			}},
		{20, {6, 34, 62, 90}, {
			28, 3, 107, 5, 108,
			26, 3, 41, 13, 42,
			30, 15, 24, 5, 25,
			28, 15, 15, 10, 16,
			}},
		{21, {6, 28, 50, 72, 94}, {
			28, 4, 116, 4, 117,
			26, 17, 42, 0, 0,
			28, 17, 22, 6, 23,
			30, 19, 16, 6, 17,
			}},
		{22, {6, 26, 50, 74, 98}, {
			28, 2, 111, 7, 112,
			28, 17, 46, 0, 0,
			30, 7, 24, 16, 25,
			24, 34, 13, 0, 0,
			}},
		{23, {6, 30, 54, 78, 102}, {
			30, 4, 121, 5, 122,
			28, 4, 47, 14, 48,
			30, 11, 24, 14, 25,
			30, 16, 15, 14, 16,
			}},
		{24, {6, 28, 54, 80, 106}, {
			30, 6, 117, 4, 118,
			28, 6, 45, 14, 46,
			30, 11, 24, 16, 25,
			30, 30, 16, 2, 17,
			}},
		{25, {6, 32, 58, 84, 110}, {
			26, 8, 106, 4, 107,
			28, 8, 47, 13, 48,
			30, 7, 24, 22, 25,
			30, 22, 15, 13, 16,
			}},
		{26, {6, 30, 58, 86, 114}, {
			28, 10, 114, 2, 115,
			28, 19, 46, 4, 47,
			28, 28, 22, 6, 23,
			30, 33, 16, 4, 17,
			}},
		{27, {6, 34, 62, 90, 118}, {
			30, 8, 122, 4, 123,
			28, 22, 45, 3, 46,
			30, 8, 23, 26, 24,
			30, 12, 15, 28, 16,
			}},
		{28, {6, 26, 50, 74, 98, 122}, {
			30, 3, 117, 10, 118,
			28, 3, 45, 23, 46,
			30, 4, 24, 31, 25,
			30, 11, 15, 31, 16,
			}},
		{29, {6, 30, 54, 78, 102, 126}, {
			30, 7, 116, 7, 117,
			28, 21, 45, 7, 46,
			30, 1, 23, 37, 24,
			30, 19, 15, 26, 16,
			}},
		{30, {6, 26, 52, 78, 104, 130}, {
			30, 5, 115, 10, 116,
			28, 19, 47, 10, 48,
			30, 15, 24, 25, 25,
			30, 23, 15, 25, 16,
			}},
		{31, {6, 30, 56, 82, 108, 134}, {
			30, 13, 115, 3, 116,
			28, 2, 46, 29, 47,
			30, 42, 24, 1, 25,
			30, 23, 15, 28, 16,
			}},
		{32, {6, 34, 60, 86, 112, 138}, {
			30, 17, 115, 0, 0,
			28, 10, 46, 23, 47,
			30, 10, 24, 35, 25,
			30, 19, 15, 35, 16,
			}},
		{33, {6, 30, 58, 86, 114, 142}, {
			30, 17, 115, 1, 116,
			28, 14, 46, 21, 47,
			30, 29, 24, 19, 25,
			30, 11, 15, 46, 16,
			}},
		{34, {6, 34, 62, 90, 118, 146}, {
			30, 13, 115, 6, 116,
			28, 14, 46, 23, 47,
			30, 44, 24, 7, 25,
			30, 59, 16, 1, 17,
			}},
		{35, {6, 30, 54, 78, 102, 126, 150}, {
			30, 12, 121, 7, 122,
			28, 12, 47, 26, 48,
			30, 39, 24, 14, 25,
			30, 22, 15, 41, 16,
			}},
		{36, {6, 24, 50, 76, 102, 128, 154}, {
			30, 6, 121, 14, 122,
			28, 6, 47, 34, 48,
			30, 46, 24, 10, 25,
			30, 2, 15, 64, 16,
			}},
		{37, {6, 28, 54, 80, 106, 132, 158}, {
			30, 17, 122, 4, 123,
			28, 29, 46, 14, 47,
			30, 49, 24, 10, 25,
			30, 24, 15, 46, 16,
			}},
		{38, {6, 32, 58, 84, 110, 136, 162}, {
			30, 4, 122, 18, 123,
			28, 13, 46, 32, 47,
			30, 48, 24, 14, 25,
			30, 42, 15, 32, 16,
			}},
		{39, {6, 26, 54, 82, 110, 138, 166}, {
			30, 20, 117, 4, 118,
			28, 40, 47, 7, 48,
			30, 43, 24, 22, 25,
			30, 10, 15, 67, 16,
			}},
		{40, {6, 30, 58, 86, 114, 142, 170}, {
			30, 19, 118, 6, 119,
			28, 18, 47, 31, 48,
			30, 34, 24, 34, 25,
			30, 20, 15, 61, 16
			}},
	};

	if (number < 1 || number > 40)
		return nullptr;
	return allVersions + number - 1;
}